

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

void __thiscall TCPSocket::ConnectionClosed::ConnectionClosed(ConnectionClosed *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Connection closed",&local_31);
  TCPSocketError::TCPSocketError(&this->super_TCPSocketError,&local_30,0);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_TCPSocketError = &PTR__TCPSocketError_001c3870;
  return;
}

Assistant:

ConnectionClosed() : TCPSocketError("Connection closed"){}